

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

optional<long> slang::parseInt<long>(string_view name,string_view value,string *error)

{
  bool bVar1;
  const_pointer pvVar2;
  size_type sVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  v9 *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  __integer_from_chars_result_type<long> _Var5;
  optional<long> oVar6;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  basic_string_view<char,_std::char_traits<char>_> *local_260 [2];
  string local_250;
  char *local_230;
  __integer_from_chars_result_type<long> result;
  const_pointer end;
  long val;
  string local_200;
  string *local_1e0;
  string *error_local;
  string_view value_local;
  string_view name_local;
  undefined1 local_1b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_1a8 [2];
  undefined1 local_198 [16];
  v9 *local_188;
  char *local_180;
  char **local_178;
  long local_170;
  char *pcStack_168;
  string *local_160;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_158;
  undefined1 local_138 [16];
  basic_string_view<char,_std::char_traits<char>_> *local_128;
  char *local_120;
  char **local_118;
  v9 *local_110;
  basic_string_view<char,_std::char_traits<char>_> *local_108;
  char *pcStack_100;
  string *local_f8;
  char *local_f0;
  basic_string_view<char,_std::char_traits<char>_> **local_e8;
  basic_string_view<char,_std::char_traits<char>_> **local_e0;
  basic_string_view<char,_std::char_traits<char>_> *local_d8;
  char *pcStack_d0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_c0;
  undefined1 *local_b8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  char *local_90;
  basic_string_view<char,_std::char_traits<char>_> **local_88;
  char *local_80;
  char *local_78;
  long *local_70;
  char *local_68;
  long *local_60;
  char *local_58;
  long *local_50;
  v9 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  **local_10;
  
  this = (v9 *)name._M_str;
  value_local._M_str = (char *)name._M_len;
  value_local._M_len = (size_t)value._M_str;
  error_local = (string *)value._M_len;
  local_1e0 = error;
  name_local._M_len = (size_t)this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&error_local);
  if (bVar1) {
    local_70 = &val;
    local_78 = "expected value for argument \'{}\'";
    local_68 = "expected value for argument \'{}\'";
    val = (long)anon_var_dwarf_2b8911;
    local_60 = local_70;
    local_180 = (char *)std::char_traits<char>::length("expected value for argument \'{}\'");
    local_58 = local_78;
    local_160 = &local_200;
    local_170 = val;
    local_178 = &value_local._M_str;
    local_50 = &local_170;
    local_188 = (v9 *)val;
    pcStack_168 = local_180;
    local_48 = local_188;
    pcStack_40 = local_180;
    local_1a8[0] = ::fmt::v9::
                   make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::basic_string_view<char,std::char_traits<char>>&>
                             ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                               *)local_178,this,
                              (basic_string_view<char,_std::char_traits<char>_> *)local_160);
    local_30 = local_198;
    local_38 = local_1a8;
    local_20 = 0xd;
    fmt.size_ = 0xd;
    fmt.data_ = local_180;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v9::vformat_abi_cxx11_(&local_200,local_188,fmt,args);
    std::__cxx11::string::operator=((string *)local_1e0,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::optional<long>::optional((optional<long> *)&name_local._M_str);
    uVar4 = extraout_RDX;
  }
  else {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&error_local);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&error_local);
    result._8_8_ = pvVar2 + sVar3;
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&error_local);
    _Var5 = std::from_chars<long>(pvVar2,(char *)result._8_8_,(long *)&end,10);
    local_230 = _Var5.ptr;
    result.ptr._0_4_ = _Var5.ec;
    if (((errc)result.ptr == 0) && (local_230 == (char *)result._8_8_)) {
      std::optional<long>::optional<long,_true>((optional<long> *)&name_local._M_str,(long *)&end);
      uVar4 = extraout_RDX_01;
    }
    else {
      local_e8 = local_260;
      local_f0 = "invalid value \'{}\' for integer argument \'{}\'";
      local_90 = "invalid value \'{}\' for integer argument \'{}\'";
      local_260[0] = (basic_string_view<char,_std::char_traits<char>_> *)0x6e0536;
      local_88 = local_e8;
      local_120 = (char *)std::char_traits<char>::length
                                    ("invalid value \'{}\' for integer argument \'{}\'");
      local_80 = local_f0;
      local_f8 = &local_250;
      local_108 = local_260[0];
      local_110 = (v9 *)&error_local;
      local_118 = &value_local._M_str;
      local_e0 = &local_108;
      local_128 = local_260[0];
      pcStack_100 = local_120;
      local_d8 = local_128;
      pcStack_d0 = local_120;
      ::fmt::v9::
      make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                (&local_158,local_110,(basic_string_view<char,_std::char_traits<char>_> *)local_118,
                 local_260[0]);
      local_b8 = local_138;
      local_c0 = &local_158;
      local_a0 = 0xdd;
      fmt_00.size_ = 0xdd;
      fmt_00.data_ = local_120;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_c0;
      local_b0 = local_c0;
      local_a8 = local_c0;
      local_98 = local_b8;
      ::fmt::v9::vformat_abi_cxx11_(&local_250,(v9 *)local_128,fmt_00,args_00);
      std::__cxx11::string::operator=((string *)local_1e0,(string *)&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::optional<long>::optional((optional<long> *)&name_local._M_str);
      uVar4 = extraout_RDX_00;
    }
  }
  oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_ =
       (undefined7)((ulong)uVar4 >> 8);
  oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = (bool)local_1b0;
  oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload = (_Storage<long,_true>)name_local._M_str;
  return (optional<long>)
         oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

static std::optional<T> parseInt(string_view name, string_view value, std::string& error) {
    if (value.empty()) {
        error = fmt::format("expected value for argument '{}'", name);
        return {};
    }

    T val;
    auto end = value.data() + value.size();
    auto result = std::from_chars(value.data(), end, val);
    if (result.ec != std::errc() || result.ptr != end) {
        error = fmt::format("invalid value '{}' for integer argument '{}'", value, name);
        return {};
    }

    return val;
}